

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm.cpp
# Opt level: O2

pair<bool,_bool> anon_unknown.dwarf_605a40::has_extdir_or_ho(BCRec *bcrec,int ncomp,int dir)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ushort uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  lVar2 = 0;
  uVar3 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    uVar3 = 0;
  }
  uVar4 = 0;
  bVar5 = false;
  for (; uVar3 * 0x18 - lVar2 != 0; lVar2 = lVar2 + 0x18) {
    bVar7 = true;
    bVar6 = uVar4 == 0;
    uVar4 = 1;
    if (bVar6) {
      iVar1 = *(int *)((long)bcrec->bc + lVar2 + (long)dir * 4);
      uVar4 = 1;
      if (iVar1 != 3) {
        uVar4 = (ushort)(iVar1 == 4);
      }
    }
    if ((bVar5 == false) &&
       (iVar1 = *(int *)((long)bcrec->bc + lVar2 + (long)(dir + 3) * 4), iVar1 != 3)) {
      bVar7 = iVar1 == 4;
    }
    bVar5 = bVar7;
  }
  return (pair<bool,_bool>)(uVar4 | (ushort)bVar5 << 8);
}

Assistant:

std::pair<bool,bool> has_extdir_or_ho (BCRec const* bcrec, int ncomp, int dir)
    {
        std::pair<bool,bool> r{false,false};
        for (int n = 0; n < ncomp; ++n) {
            r.first = r.first
                 || (bcrec[n].lo(dir) == BCType::ext_dir)
                 || (bcrec[n].lo(dir) == BCType::hoextrap);
            r.second = r.second
                 || (bcrec[n].hi(dir) == BCType::ext_dir)
                 || (bcrec[n].hi(dir) == BCType::hoextrap);
        }
        return r;
    }